

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O2

void __thiscall cppcms::http::content_type::parse(content_type *this,char *begin,char *end)

{
  byte bVar1;
  element_type *peVar2;
  char *pcVar3;
  char *pcVar4;
  char *end_00;
  size_type sVar5;
  byte bVar6;
  bool bVar7;
  char *tmp;
  string value;
  string param;
  string subtype;
  string type;
  char *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  pcVar3 = protocol::skip_ws<char_const*>(begin,end);
  if (pcVar3 != end) {
    pcVar4 = protocol::tocken<char_const*>(pcVar3,end);
    if (pcVar4 != pcVar3) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar3,pcVar4);
      if ((pcVar4 != end) && (*pcVar4 == '/')) {
        pcVar4 = pcVar4 + 1;
        pcVar3 = protocol::tocken<char_const*>(pcVar4,end);
        if (pcVar3 != pcVar4) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar4,pcVar3);
          for (sVar5 = 0; local_90._M_string_length != sVar5; sVar5 = sVar5 + 1) {
            bVar1 = local_90._M_dataplus._M_p[sVar5];
            bVar6 = bVar1 | 0x20;
            if ((byte)(bVar1 + 0xa5) < 0xe6) {
              bVar6 = bVar1;
            }
            local_90._M_dataplus._M_p[sVar5] = bVar6;
          }
          for (sVar5 = 0; local_b0._M_string_length != sVar5; sVar5 = sVar5 + 1) {
            bVar1 = local_b0._M_dataplus._M_p[sVar5];
            bVar6 = bVar1 | 0x20;
            if ((byte)(bVar1 + 0xa5) < 0xe6) {
              bVar6 = bVar1;
            }
            local_b0._M_dataplus._M_p[sVar5] = bVar6;
          }
          std::__cxx11::string::_M_assign
                    ((string *)
                     (this->d).
                     super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          std::__cxx11::string::_M_assign
                    ((string *)
                     &((this->d).
                       super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->subtype);
          std::operator+(&local_d0,&local_90,"/");
          std::operator+(&local_70.first,&local_d0,&local_b0);
          std::__cxx11::string::operator=
                    ((string *)
                     &((this->d).
                       super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->media_type,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          while (pcVar3 != end) {
            pcVar3 = protocol::skip_ws<char_const*>(pcVar3,end);
            if ((pcVar3 == end) || (*pcVar3 != ';')) break;
            pcVar3 = protocol::skip_ws<char_const*>(pcVar3 + 1,end);
            if (pcVar3 == end) break;
            pcVar4 = protocol::tocken<char_const*>(pcVar3,end);
            if (pcVar4 == pcVar3) break;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar3,pcVar4);
            for (pcVar3 = (char *)0x0; (char *)local_d0._M_string_length != pcVar3;
                pcVar3 = pcVar3 + 1) {
              bVar1 = local_d0._M_dataplus._M_p[(long)pcVar3];
              bVar6 = bVar1 | 0x20;
              if ((byte)(bVar1 + 0xa5) < 0xe6) {
                bVar6 = bVar1;
              }
              local_d0._M_dataplus._M_p[(long)pcVar3] = bVar6;
            }
            end_00 = (char *)local_d0._M_string_length;
            pcVar4 = protocol::skip_ws<char_const*>(pcVar4,end);
            pcVar3 = pcVar4;
            if (pcVar4 == end) {
LAB_00214d3a:
              bVar7 = false;
            }
            else {
              pcVar3 = pcVar4 + 1;
              if (*pcVar4 == '=') {
                pcVar3 = protocol::skip_ws<char_const*>(pcVar3,end);
                if (pcVar3 == end) goto LAB_00214d3a;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                local_f0._M_string_length = 0;
                local_f0.field_2._M_local_buf[0] = '\0';
                if (*pcVar3 == '\"') {
                  local_f8 = pcVar3;
                  protocol::unquote<char_const*>
                            (&local_70.first,(protocol *)&local_f8,(char **)end,end_00);
                  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_70);
                  std::__cxx11::string::~string((string *)&local_70);
                  bVar7 = local_f8 == pcVar3;
                  pcVar3 = local_f8;
                  if (bVar7) {
                    bVar7 = false;
                  }
                  else {
LAB_00214d6a:
                    peVar2 = (this->d).
                             super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                              (&local_70,&local_d0,&local_f0);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&peVar2->parameters,&local_70);
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~pair(&local_70);
                    bVar7 = true;
                  }
                }
                else {
                  pcVar4 = protocol::tocken<char_const*>(pcVar3,end);
                  if (pcVar4 != pcVar3) {
                    std::__cxx11::string::assign<char_const*,void>
                              ((string *)&local_f0,pcVar3,pcVar4);
                    pcVar3 = pcVar4;
                    goto LAB_00214d6a;
                  }
                  bVar7 = false;
                }
                std::__cxx11::string::~string((string *)&local_f0);
              }
              else {
                bVar7 = false;
              }
            }
            std::__cxx11::string::~string((string *)&local_d0);
            if (!bVar7) break;
          }
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void content_type::parse(char const *begin,char const *end)
	{
		begin = protocol::skip_ws(begin,end);	
		if(begin == end)
			return;
		char const *type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string type(begin,type_end);
		begin = type_end;
		if(begin == end || *begin++ != '/')
			return;
		type_end = protocol::tocken(begin,end);
		if(type_end == begin)
			return;
		std::string subtype(begin,type_end);
		begin = type_end;
		std::transform(type.begin(),type.end(),type.begin(),protocol::ascii_to_lower);
		std::transform(subtype.begin(),subtype.end(),subtype.begin(),protocol::ascii_to_lower);
		d->type = type;
		d->subtype = subtype;
		d->media_type = type + "/" + subtype;
		while(begin!=end) {
			begin = protocol::skip_ws(begin,end);
			if(begin == end || *begin++ != ';' || (begin=protocol::skip_ws(begin,end))==end)
				return;
			char const *param_end = protocol::tocken(begin,end);
			if(param_end == begin)
				return;
			std::string param(begin,param_end);
			std::transform(param.begin(),param.end(),param.begin(),protocol::ascii_to_lower);
			begin = protocol::skip_ws(param_end,end);
			if(begin==end || *begin++!='=')
				return;
			begin = protocol::skip_ws(begin,end);
			if(begin==end)
				return;
			std::string value;
			if(*begin == '"') {
				char const *tmp = begin;
				value = protocol::unquote(tmp,end);
				if(tmp == begin)
					return;
				begin = tmp;
			}
			else {
				char const *tmp = protocol::tocken(begin,end);
				if(tmp == begin)
					return;
				value.assign(begin,tmp);
				begin = tmp;
			}
			d->parameters.insert(std::make_pair(param,value));
		}
	}